

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::removeUnneededInstructions
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  uint32_t local_90;
  uint32_t local_8c;
  inst_iterator local_88;
  inst_iterator local_80;
  inst_iterator local_78;
  inst_iterator local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_90 = BasicBlock::id(block);
  sVar3 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->predecessors_after_begin_)._M_h,&local_90);
  if (sVar3 == 0) {
    local_8c = BasicBlock::id(block);
    sVar3 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->after_begin_)._M_h,&local_8c);
    if (sVar3 != 0) {
      bVar1 = killDuplicateBegin(this,block);
      goto LAB_00200c89;
    }
  }
  local_90 = BasicBlock::id(block);
  sVar3 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->predecessors_after_begin_)._M_h,&local_90);
  if (sVar3 == 0) {
    bVar1 = false;
  }
  else {
    local_70.super_iterator.node_ =
         (iterator)
         (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
         super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_78.super_iterator.node_ =
         (iterator)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:276:39)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:276:39)>
               ::_M_manager;
    bVar1 = IRContext::KillInstructionIf
                      ((this->super_Pass).context_,&local_70,&local_78,
                       (function<bool_(spvtools::opt::Instruction_*)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
LAB_00200c89:
  local_90 = BasicBlock::id(block);
  sVar3 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->successors_before_end_)._M_h,&local_90);
  if (sVar3 == 0) {
    local_8c = BasicBlock::id(block);
    sVar3 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->before_end_)._M_h,&local_8c);
    if (sVar3 != 0) {
      bVar2 = killDuplicateEnd(this,block);
      return (bool)(bVar1 | bVar2);
    }
  }
  local_90 = BasicBlock::id(block);
  sVar3 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->successors_before_end_)._M_h,&local_90);
  if (sVar3 != 0) {
    local_80.super_iterator.node_ =
         (iterator)
         (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
         super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_88.super_iterator.node_ =
         (iterator)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:287:39)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:287:39)>
               ::_M_manager;
    bVar2 = IRContext::KillInstructionIf
                      ((this->super_Pass).context_,&local_80,&local_88,
                       (function<bool_(spvtools::opt::Instruction_*)> *)&local_68);
    bVar1 = (bool)(bVar1 | bVar2);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  return bVar1;
}

Assistant:

bool InvocationInterlockPlacementPass::removeUnneededInstructions(
    BasicBlock* block) {
  bool modified = false;
  if (!predecessors_after_begin_.count(block->id()) &&
      after_begin_.count(block->id())) {
    // None of the previous blocks are in the critical section, but this block
    // is. This can only happen if this block already has at least one begin
    // instruction. Leave the first begin instruction, and remove any others.
    modified |= killDuplicateBegin(block);
  } else if (predecessors_after_begin_.count(block->id())) {
    // At least one previous block is in the critical section; remove all
    // begin instructions in this block.
    modified |= context()->KillInstructionIf(
        block->begin(), block->end(), [](Instruction* inst) {
          return inst->opcode() == spv::Op::OpBeginInvocationInterlockEXT;
        });
  }

  if (!successors_before_end_.count(block->id()) &&
      before_end_.count(block->id())) {
    // Same as above
    modified |= killDuplicateEnd(block);
  } else if (successors_before_end_.count(block->id())) {
    modified |= context()->KillInstructionIf(
        block->begin(), block->end(), [](Instruction* inst) {
          return inst->opcode() == spv::Op::OpEndInvocationInterlockEXT;
        });
  }
  return modified;
}